

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

bool __thiscall FM::OPNABase::SetRate(OPNABase *this,uint c,uint r,bool param_3)

{
  byte bVar1;
  uint uVar2;
  uint32 uVar3;
  
  (this->super_OPNBase).clock = c >> 1;
  uVar2 = (uint)((((double)(c >> 1) / 72.0) * 8192.0) / (double)r);
  (this->super_OPNBase).psgrate = r;
  this->adplbase = uVar2;
  this->adpld = uVar2 * this->deltan >> 0x10;
  bVar1 = (this->super_OPNBase).prescale;
  (this->super_OPNBase).prescale = 0xff;
  OPNBase::SetPrescaler(&this->super_OPNBase,(uint)bVar1);
  uVar3 = 0;
  if ((this->reg22 & 8) != 0) {
    uVar3 = (&OPNBase::lfotable)[this->reg22 & 7];
  }
  this->lfodcount = uVar3;
  return true;
}

Assistant:

bool OPNABase::SetRate(uint c, uint r, bool)
{
	c /= 2;		// �]���łƂ̌݊������d�����������R�����g�A�E�g���悤

	OPNBase::Init(c, r);

	adplbase = int(8192. * (clock/72.) / r);
	adpld = deltan * adplbase >> 16;

	RebuildTimeTable();

	lfodcount = reg22 & 0x08 ? lfotable[reg22 & 7] : 0;
	return true;
}